

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmutil.c
# Opt level: O3

PmError Pm_Enqueue(PmQueue *q,void *msg)

{
  undefined4 *puVar1;
  int iVar2;
  long lVar3;
  undefined4 *puVar4;
  long lVar5;
  long lVar6;
  
  if (q == (PmQueue *)0x0) {
    return pmBadPtr;
  }
  if (*(long *)((long)q + 0x18) == 0) {
    iVar2 = *(int *)((long)q + 0x20);
    if ((long)iVar2 < 1) {
      lVar3 = *(long *)((long)q + 8);
      lVar5 = 1;
      puVar4 = (undefined4 *)(lVar3 * 4 + *(long *)((long)q + 0x28));
    }
    else {
      lVar3 = *(long *)((long)q + 8);
      puVar1 = (undefined4 *)(*(long *)((long)q + 0x28) + lVar3 * 4);
      lVar5 = 0;
      do {
        if (puVar1[lVar5] != 0) {
          *(long *)((long)q + 0x18) = lVar3 + 1;
          return pmBufferOverflow;
        }
        lVar5 = lVar5 + 1;
      } while (iVar2 != lVar5);
      lVar5 = 1;
      puVar4 = puVar1;
      if (iVar2 != 1) {
        lVar5 = 1;
        lVar6 = 4;
        do {
          iVar2 = *(int *)((long)msg + lVar5 * 4 + -4);
          if (iVar2 == 0) {
            *puVar4 = (int)lVar5;
            puVar4 = (undefined4 *)((long)puVar1 + lVar6);
          }
          else {
            puVar1[lVar5] = iVar2;
          }
          lVar5 = lVar5 + 1;
          lVar6 = lVar6 + 4;
        } while (lVar5 < *(int *)((long)q + 0x20));
      }
    }
    *puVar4 = (int)lVar5;
    lVar3 = *(int *)((long)q + 0x20) + lVar3;
    lVar5 = 0;
    if (lVar3 != *(long *)((long)q + 0x10)) {
      lVar5 = lVar3;
    }
    *(long *)((long)q + 8) = lVar5;
    return pmNoData;
  }
  return pmBufferOverflow;
}

Assistant:

PMEXPORT PmError Pm_Enqueue(PmQueue *q, void *msg)
{
    PmQueueRep *queue = (PmQueueRep *) q;
    long tail;
    int i;
    int32_t *src = (int32_t *) msg;
    int32_t *ptr;
    int32_t *dest;
    int rslt;
    if (!queue) 
        return pmBadPtr;
    /* no more enqueue until receiver acknowledges overflow */
    if (queue->overflow) return pmBufferOverflow;
    rslt = Pm_QueueFull(q);
    /* already checked above: if (rslt == pmBadPtr) return rslt; */
    tail = queue->tail;
    if (rslt) {
        queue->overflow = tail + 1;
        return pmBufferOverflow;
    }

    /* queue is has room for message, and overflow flag is cleared */
    ptr = &queue->buffer[tail];
    dest = ptr + 1;
    for (i = 1; i < queue->msg_size; i++) {
        int32_t j = src[i - 1];
        if (!j) {
            *ptr = i;
            ptr = dest;
        } else {
            *dest = j;
        }
        dest++;
    }
    *ptr = i;
    tail += queue->msg_size;
    if (tail == queue->len) tail = 0;
    queue->tail = tail;
    return pmNoError;
}